

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O1

escape_value __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_escape<char_const*>
          (regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
           *this,char **begin,char *end)

{
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *tr;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  escape_value<char,_unsigned_short> eVar7;
  escape_value eVar8;
  char *tmp;
  undefined **local_60 [2];
  undefined **local_50;
  refcount_ptr<boost::exception_detail::error_info_container> local_48;
  char *pcStack_40;
  char *local_38;
  undefined8 local_30;
  error_type local_28;
  
  if (*begin == end) {
    std::runtime_error::runtime_error((runtime_error *)local_60,"incomplete escape sequence");
    local_48.px_ = (error_info_container *)0x0;
    local_60[0] = &PTR__regex_error_00195328;
    local_50 = &PTR__regex_error_00195350;
    local_28 = error_escape;
    pcStack_40 = 
    "escape_value boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_escape(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
    ;
    local_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
    ;
    local_30._0_4_ = 0x2d2;
    local_30._4_4_ = -1;
    throw_exception<boost::xpressive::regex_error>((regex_error *)local_60);
  }
  tr = (compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
        *)(this + 0x10);
  iVar1 = cpp_regex_traits<char>::value((cpp_regex_traits<char> *)tr,**begin,10);
  if (0 < iVar1) {
    local_60[0] = (undefined **)*begin;
    uVar2 = detail::
            toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                      ((char **)local_60,end,
                       (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)tr,10,999);
    uVar3 = (ulong)uVar2;
    if (((int)uVar2 < 10) || ((int)uVar2 <= *(int *)this)) {
      *begin = (char *)local_60[0];
      uVar5 = 0x100000000;
      uVar4 = 0;
      uVar6 = 0;
      goto LAB_0012af9b;
    }
  }
  eVar7 = detail::
          parse_escape<char_const*,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
                    (begin,end,tr);
  uVar5 = eVar7._8_8_;
  uVar4 = (ulong)(byte)eVar7.ch_;
  uVar3 = eVar7._0_8_ >> 0x20;
  uVar6 = (ulong)(eVar7._0_4_ & 0xffffff00);
LAB_0012af9b:
  eVar8._0_8_ = uVar3 << 0x20 | uVar6 | uVar4;
  eVar8.class_ = (short)uVar5;
  eVar8._10_2_ = (short)((ulong)uVar5 >> 0x10);
  eVar8.type_ = (int)((ulong)uVar5 >> 0x20);
  return eVar8;
}

Assistant:

escape_value parse_escape(FwdIter &begin, FwdIter end)
    {
        BOOST_XPR_ENSURE_(begin != end, regex_constants::error_escape, "incomplete escape sequence");

        // first, check to see if this can be a backreference
        if(0 < this->rxtraits().value(*begin, 10))
        {
            // Parse at most 3 decimal digits.
            FwdIter tmp = begin;
            int mark_nbr = detail::toi(tmp, end, this->rxtraits(), 10, 999);

            // If the resulting number could conceivably be a backref, then it is.
            if(10 > mark_nbr || mark_nbr <= static_cast<int>(this->mark_count_))
            {
                begin = tmp;
                escape_value esc = {0, mark_nbr, 0, detail::escape_mark};
                return esc;
            }
        }

        // Not a backreference, defer to the parse_escape helper
        return detail::parse_escape(begin, end, this->traits_);
    }